

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcSimulationDataGenerator.cpp
# Opt level: O2

U32 __thiscall
HdlcSimulationDataGenerator::GenerateSimulationData
          (HdlcSimulationDataGenerator *this,U64 largest_sample_requested,U32 sample_rate,
          SimulationChannelDescriptor **simulation_channel)

{
  U8 UVar1;
  HdlcFrameType frameType;
  HdlcAddressType addressType;
  HdlcControlType controlType;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  HdlcSimulationDataGenerator *this_00;
  U16 size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> information;
  vector<unsigned_char,_std::allocator<unsigned_char>_> control;
  vector<unsigned_char,_std::allocator<unsigned_char>_> address;
  
  this_00 = (HdlcSimulationDataGenerator *)(ulong)sample_rate;
  uVar3 = AnalyzerHelpers::AdjustSimulationTargetSample
                    (largest_sample_requested,sample_rate,this->mSimulationSampleRateHz);
  while( true ) {
    uVar4 = SimulationChannelDescriptor::GetCurrentSampleNumber();
    if (uVar3 <= uVar4) break;
    CreateFlag(this);
    CreateFlag(this);
    size = 0;
    frameType = this->mFrameTypes[(ulong)this->mFrameNumber % 3];
    if (frameType != HDLC_S_FRAME) {
      iVar2 = rand();
      size = (short)(iVar2 % 4) + 1;
    }
    iVar2 = rand();
    addressType = this->mSettings->mHdlcAddr;
    UVar1 = this->mAddresByteValue;
    this->mAddresByteValue = UVar1 + '\x01';
    GenAddressField(&address,this_00,addressType,(long)(iVar2 % 4 + 1),UVar1);
    controlType = this->mSettings->mHdlcControl;
    UVar1 = this->mControlValue;
    this->mControlValue = UVar1 + '\x01';
    GenControlField((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    &control.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>,
                    this_00,frameType,controlType,UVar1);
    UVar1 = this->mInformationByteValue;
    this->mInformationByteValue = UVar1 + '\x01';
    GenInformationField((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        &information.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>,this_00,
                        size,UVar1);
    this_00 = (HdlcSimulationDataGenerator *)&address;
    CreateHDLCFrame(this,&address,
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    &control.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>,
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    &information.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    CreateFlag(this);
    CreateFlag(this);
    this->mFrameNumber = this->mFrameNumber + 1;
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&information.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&control.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&address);
  }
  *simulation_channel = &this->mHdlcSimulationData;
  return 1;
}

Assistant:

U32 HdlcSimulationDataGenerator::GenerateSimulationData( U64 largest_sample_requested, U32 sample_rate,
                                                         SimulationChannelDescriptor** simulation_channel )
{
    U64 adjusted_largest_sample_requested =
        AnalyzerHelpers::AdjustSimulationTargetSample( largest_sample_requested, sample_rate, mSimulationSampleRateHz );

    while( mHdlcSimulationData.GetCurrentSampleNumber() < adjusted_largest_sample_requested )
    {
        // Two consecutive flags
        CreateFlag();
        CreateFlag();

        HdlcFrameType frameType = mFrameTypes[ mFrameNumber % 3 ];
        U32 sizeOfInformation = ( frameType == HDLC_S_FRAME ) ? 0 : ( ( rand() % 4 ) + 1 );
        U64 addressBytes = ( ( rand() % 4 ) + 1 );

        vector<U8> address = GenAddressField( mSettings->mHdlcAddr, addressBytes, mAddresByteValue++ );
        vector<U8> control = GenControlField( frameType, mSettings->mHdlcControl, mControlValue++ );
        vector<U8> information = GenInformationField( sizeOfInformation, mInformationByteValue++ );

        CreateHDLCFrame( address, control, information );

        // Two consecutive flags
        CreateFlag();
        CreateFlag();

        mFrameNumber++;
    }

    *simulation_channel = &mHdlcSimulationData;
    return 1;
}